

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info.cpp
# Opt level: O2

void __thiscall duckdb::ProfilingInfo::ResetMetrics(ProfilingInfo *this)

{
  profiler_metrics_t *this_00;
  size_type *__k;
  bool bVar1;
  Value *this_01;
  InternalException *this_02;
  char *value;
  __node_base *p_Var2;
  Value local_b0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->metrics;
  ::std::
  _Hashtable<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  p_Var2 = &(this->expanded_settings)._M_h._M_before_begin;
switchD_019ccf9c_caseD_3:
  p_Var2 = p_Var2->_M_nxt;
  if (p_Var2 == (__node_base *)0x0) {
    return;
  }
  __k = (size_type *)(p_Var2 + 1);
  bVar1 = MetricsUtils::IsOptimizerMetric((MetricsType)*(size_type *)(p_Var2 + 1));
  if ((!bVar1) && (bVar1 = MetricsUtils::IsPhaseTimingMetric((MetricsType)*__k), !bVar1))
  goto LAB_019ccf85;
  Value::CreateValue<double>(&local_b0,0.0);
  this_01 = ::std::__detail::
            _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,(key_type *)__k);
  goto LAB_019ccf70;
LAB_019ccf85:
  switch((key_type)*__k) {
  case QUERY_NAME:
    Value::CreateValue<char_const*>(&local_b0,(Value *)(anon_var_dwarf_3b2a81b + 9),value);
    this_01 = ::std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)__k);
    break;
  case BLOCKED_THREAD_TIME:
  case CPU_TIME:
  case OPERATOR_TIMING:
  case LATENCY:
    Value::CreateValue<double>(&local_b0,0.0);
    this_01 = ::std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)__k);
    break;
  case EXTRA_INFO:
    goto switchD_019ccf9c_caseD_3;
  case CUMULATIVE_CARDINALITY:
  case OPERATOR_CARDINALITY:
  case CUMULATIVE_ROWS_SCANNED:
  case OPERATOR_ROWS_SCANNED:
  case RESULT_SET_SIZE:
  case ROWS_RETURNED:
  case SYSTEM_PEAK_BUFFER_MEMORY:
  case SYSTEM_PEAK_TEMP_DIR_SIZE:
    Value::CreateValue<unsigned_long>(&local_b0,0);
    this_01 = ::std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)__k);
    break;
  case OPERATOR_TYPE:
    Value::CreateValue<unsigned_char>(&local_b0,'\0');
    this_01 = ::std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)__k);
    break;
  case OPERATOR_NAME:
    Value::CreateValue<char_const*>(&local_b0,(Value *)(anon_var_dwarf_3b2a81b + 9),value);
    this_01 = ::std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)__k);
    break;
  default:
    goto switchD_019ccf9c_default;
  }
LAB_019ccf70:
  Value::operator=(this_01,&local_b0);
  Value::~Value(&local_b0);
  goto switchD_019ccf9c_caseD_3;
switchD_019ccf9c_default:
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  EnumUtil::ToString<duckdb::MetricsType>(&local_70,(MetricsType)*__k);
  ::std::operator+(&local_50,"MetricsType",&local_70);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   &local_50,"not implemented");
  InternalException::InternalException(this_02,(string *)&local_b0);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ProfilingInfo::ResetMetrics() {
	metrics.clear();
	for (auto &metric : expanded_settings) {
		if (MetricsUtils::IsOptimizerMetric(metric) || MetricsUtils::IsPhaseTimingMetric(metric)) {
			metrics[metric] = Value::CreateValue(0.0);
			continue;
		}

		switch (metric) {
		case MetricsType::QUERY_NAME:
			metrics[metric] = Value::CreateValue("");
			break;
		case MetricsType::LATENCY:
		case MetricsType::BLOCKED_THREAD_TIME:
		case MetricsType::CPU_TIME:
		case MetricsType::OPERATOR_TIMING:
			metrics[metric] = Value::CreateValue(0.0);
			break;
		case MetricsType::OPERATOR_NAME:
			metrics[metric] = Value::CreateValue("");
			break;
		case MetricsType::OPERATOR_TYPE:
			metrics[metric] = Value::CreateValue<uint8_t>(0);
			break;
		case MetricsType::ROWS_RETURNED:
		case MetricsType::RESULT_SET_SIZE:
		case MetricsType::CUMULATIVE_CARDINALITY:
		case MetricsType::OPERATOR_CARDINALITY:
		case MetricsType::CUMULATIVE_ROWS_SCANNED:
		case MetricsType::OPERATOR_ROWS_SCANNED:
		case MetricsType::SYSTEM_PEAK_BUFFER_MEMORY:
		case MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE:
			metrics[metric] = Value::CreateValue<uint64_t>(0);
			break;
		case MetricsType::EXTRA_INFO:
			break;
		default:
			throw InternalException("MetricsType" + EnumUtil::ToString(metric) + "not implemented");
		}
	}
}